

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void readString(bool raw)

{
  bool bVar1;
  LexerState *pLVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char v;
  char cVar8;
  ulong uVar9;
  
  pLVar2 = lexerState;
  pLVar2->disableMacroArgs = true;
  pLVar2->disableInterpolation = true;
  iVar3 = peek();
  if (iVar3 == 0x22) {
    shiftChar();
    iVar4 = peek();
    if (iVar4 != 0x22) {
      uVar9 = 0;
      goto LAB_0010e883;
    }
    shiftChar();
  }
  uVar9 = 0;
  do {
    iVar4 = peek();
    if ((iVar4 == -1) || ((iVar3 != 0x22 && ((iVar4 == 0xd || (iVar4 == 10)))))) {
      error("Unterminated string\n");
      bVar1 = true;
      goto LAB_0010e776;
    }
    shiftChar();
    if (iVar4 == 10) {
LAB_0010e613:
      pLVar2 = lexerState;
      lexerState->lineNo = lexerState->lineNo + 1;
      pLVar2->colNo = 1;
      iVar4 = 10;
    }
    else if (iVar4 == 0xd) {
      iVar4 = peek();
      if (iVar4 == 10) {
        shiftChar();
      }
      goto LAB_0010e613;
    }
    if (iVar4 == 0x7b) {
      iVar4 = 0x7b;
      if (raw) goto LAB_0010e718;
      lexerState->disableMacroArgs = false;
      pcVar7 = readInterpolation(0);
      if (pcVar7 != (char *)0x0) {
        cVar8 = *pcVar7;
        while (cVar8 != '\0') {
          pcVar7 = pcVar7 + 1;
          if (uVar9 < 0x100) {
            yylval.symName[uVar9] = cVar8;
            uVar9 = uVar9 + 1;
          }
          cVar8 = *pcVar7;
        }
      }
      lexerState->disableMacroArgs = true;
LAB_0010e774:
      bVar1 = false;
    }
    else {
      if (iVar4 == 0x5c) {
        iVar4 = 0x5c;
        if (raw) goto LAB_0010e718;
        iVar4 = peek();
        if (iVar4 < 0x30) {
          if (iVar4 < 0x20) {
            if (iVar4 == -1) {
              error("Illegal character escape at end of input\n");
              iVar4 = 0x5c;
              goto LAB_0010e718;
            }
            if ((iVar4 == 10) || (iVar4 == 0xd)) goto LAB_0010e800;
          }
          else {
            if (iVar4 == 0x20) {
LAB_0010e800:
              readLineContinuation();
              goto LAB_0010e774;
            }
            if (iVar4 == 0x22) goto LAB_0010e876;
            if (iVar4 == 0x23) goto LAB_0010e6ca;
          }
LAB_0010e85d:
          pcVar7 = printChar(iVar4);
          error("Illegal character escape %s\n",pcVar7);
        }
        else {
          if (iVar4 < 0x72) {
            uVar6 = (ulong)(iVar4 - 0x30U);
            if (iVar4 - 0x30U < 0x3f) {
              if ((0x113ffUL >> (uVar6 & 0x3f) & 1) != 0) {
LAB_0010e6ca:
                shiftChar();
                pcVar7 = readMacroArg((char)iVar4);
                if ((pcVar7 == (char *)0x0) || (cVar8 = *pcVar7, cVar8 == '\0')) goto LAB_0010e774;
                do {
                  pcVar7 = pcVar7 + 1;
                  if (uVar9 < 0x100) {
                    yylval.symName[uVar9] = cVar8;
                    uVar9 = uVar9 + 1;
                  }
                  cVar8 = *pcVar7;
                  bVar1 = false;
                } while (cVar8 != '\0');
                goto LAB_0010e776;
              }
              if (uVar6 == 0x2c) goto LAB_0010e876;
              if (uVar6 == 0x3e) {
                shiftChar();
                iVar4 = 10;
                goto LAB_0010e718;
              }
            }
            goto LAB_0010e85d;
          }
          if (iVar4 < 0x7b) {
            if (iVar4 == 0x72) {
              shiftChar();
              iVar4 = 0xd;
            }
            else {
              if (iVar4 != 0x74) goto LAB_0010e85d;
              shiftChar();
              iVar4 = 9;
            }
            goto LAB_0010e718;
          }
          if ((iVar4 != 0x7d) && (iVar4 != 0x7b)) goto LAB_0010e85d;
        }
LAB_0010e876:
        shiftChar();
LAB_0010e718:
        if (uVar9 < 0x100) {
          yylval.symName[uVar9] = (char)iVar4;
          uVar9 = uVar9 + 1;
        }
        goto LAB_0010e774;
      }
      if (iVar4 != 0x22) goto LAB_0010e718;
      bVar1 = true;
      if (iVar3 == 0x22) {
        iVar5 = peek();
        iVar4 = 0x22;
        if (iVar5 == 0x22) {
          shiftChar();
          iVar5 = peek();
          if (iVar5 == 0x22) {
            shiftChar();
            goto LAB_0010e776;
          }
          if (uVar9 < 0x100) {
            yylval.symName[uVar9] = '\"';
            uVar9 = uVar9 + 1;
          }
        }
        goto LAB_0010e718;
      }
    }
LAB_0010e776:
  } while (!bVar1);
LAB_0010e883:
  if (uVar9 == 0x100) {
    warning(WARNING_LONG_STR,"String constant too long\n");
    uVar9 = 0xff;
  }
  yylval.symName[uVar9] = '\0';
  pLVar2 = lexerState;
  pLVar2->disableMacroArgs = false;
  pLVar2->disableInterpolation = false;
  return;
}

Assistant:

static void readString(bool raw)
{
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	size_t i = 0;
	bool multiline = false;
	char const *str;

	// We reach this function after reading a single quote, but we also support triple quotes
	if (peek() == '"') {
		shiftChar();
		if (peek() == '"') {
			// """ begins a multi-line string
			shiftChar();
			multiline = true;
		} else {
			// "" is an empty string, skip the loop
			goto finish;
		}
	}

	for (;;) {
		int c = peek();

		// '\r', '\n' or EOF ends a single-line string early
		if (c == EOF || (!multiline && (c == '\r' || c == '\n'))) {
			error("Unterminated string\n");
			break;
		}

		// We'll be staying in the string, so we can safely consume the char
		shiftChar();

		// Handle '\r' or '\n' (in multiline strings only, already handled above otherwise)
		if (c == '\r' || c == '\n') {
			// Handle CRLF before nextLine() since shiftChar updates colNo
			handleCRLF(c);
			nextLine();
			c = '\n';
		}

		switch (c) {
		case '"':
			if (multiline) {
				// Only """ ends a multi-line string
				if (peek() != '"')
					break;
				shiftChar();
				if (peek() != '"') {
					append_yylval_string('"');
					break;
				}
				shiftChar();
			}
			goto finish;

		case '\\': // Character escape or macro arg
			if (raw)
				break;
			c = peek();
			switch (c) {
			case '\\':
			case '"':
			case '{':
			case '}':
				// Return that character unchanged
				shiftChar();
				break;
			case 'n':
				c = '\n';
				shiftChar();
				break;
			case 'r':
				c = '\r';
				shiftChar();
				break;
			case 't':
				c = '\t';
				shiftChar();
				break;

			// Line continuation
			case ' ':
			case '\r':
			case '\n':
				readLineContinuation();
				continue;

			// Macro arg
			case '@':
			case '#':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
			case '<':
				shiftChar();
				str = readMacroArg(c);
				if (str) {
					while (*str)
						append_yylval_string(*str++);
				}
				continue; // Do not copy an additional character

			case EOF: // Can't really print that one
				error("Illegal character escape at end of input\n");
				c = '\\';
				break;

			default:
				error("Illegal character escape %s\n", printChar(c));
				shiftChar();
				break;
			}
			break;

		case '{': // Symbol interpolation
			if (raw)
				break;
			// We'll be exiting the string scope, so re-enable expansions
			// (Not interpolations, since they're handled by the function itself...)
			lexerState->disableMacroArgs = false;
			str = readInterpolation(0);
			if (str) {
				while (*str)
					append_yylval_string(*str++);
			}
			lexerState->disableMacroArgs = true;
			continue; // Do not copy an additional character

		// Regular characters will just get copied
		}

		append_yylval_string(c);
	}

finish:
	if (i == sizeof(yylval.string)) {
		i--;
		warning(WARNING_LONG_STR, "String constant too long\n");
	}
	yylval.string[i] = '\0';

	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
}